

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_image_filters.cpp
# Opt level: O2

void __thiscall agg::image_filter_lut::realloc_lut(image_filter_lut *this,double radius)

{
  uint uVar1;
  undefined8 in_XMM0_Qb;
  undefined1 auVar2 [16];
  
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = radius;
  *(double *)this = radius;
  auVar2 = roundsd(auVar2,auVar2,10);
  uVar1 = (uint)(long)auVar2._0_8_;
  *(uint *)(this + 8) = uVar1 * 2;
  *(uint *)(this + 0xc) = 1 - (uVar1 & 0x7fffffff);
  if (*(uint *)(this + 0x18) < uVar1 << 9) {
    pod_array<short>::resize((pod_array<short> *)(this + 0x10),uVar1 << 9);
    return;
  }
  return;
}

Assistant:

void image_filter_lut::realloc_lut(double radius)
    {
        m_radius = radius;
        m_diameter = uceil(radius) * 2;
        m_start = -int(m_diameter / 2 - 1);
        unsigned size = m_diameter << image_subpixel_shift;
        if(size > m_weight_array.size())
        {
            m_weight_array.resize(size);
        }
    }